

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O3

void __thiscall chatra::Reader::registerPointer<chatra::Lock>(Reader *this,Lock *ptr)

{
  iterator __position;
  pointer pPVar1;
  
  __position._M_current =
       (this->pointerList).
       super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->pointerList).
      super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
    _M_realloc_insert<>(&this->pointerList,__position);
    pPVar1 = (this->pointerList).
             super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(undefined8 *)__position._M_current = 0;
    (__position._M_current)->raw = (void *)0x0;
    pPVar1 = (this->pointerList).
             super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->pointerList).
    super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1[-1].mode = Raw;
  pPVar1[-1].raw = ptr;
  return;
}

Assistant:

void registerPointer(Type* ptr) {
		chatra_assert(ptr != nullptr);
		pointerList.emplace_back();
		auto& p = pointerList.back();
		p.mode = PointerMode::Raw;
		p.raw = ptr;
	}